

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::ConvolutionParameter::MergeFrom(ConvolutionParameter *this,ConvolutionParameter *from)

{
  uint uVar1;
  LogMessage *other;
  FillerParameter *pFVar2;
  FillerParameter *pFVar3;
  InternalMetadataWithArena *this_00;
  LogFinisher local_d5;
  uint32 cached_has_bits;
  byte local_c1;
  LogMessage local_c0;
  ConvolutionParameter *local_88;
  ConvolutionParameter *from_local;
  ConvolutionParameter *this_local;
  InternalMetadataWithArena *local_70;
  InternalMetadataWithArena *local_68;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_c1 = 0;
  local_88 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x567d);
    local_c1 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_c0,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_d5,other);
  }
  if ((local_c1 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
  }
  this_00 = &this->_internal_metadata_;
  this_local = (ConvolutionParameter *)&local_88->_internal_metadata_;
  local_70 = this_00;
  local_68 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,&local_28->unknown_fields);
  }
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(&this->pad_,&local_88->pad_);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            (&this->kernel_size_,&local_88->kernel_size_);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(&this->stride_,&local_88->stride_);
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom(&this->dilation_,&local_88->dilation_);
  local_38 = &local_88->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      pFVar2 = mutable_weight_filler(this);
      pFVar3 = weight_filler(local_88);
      FillerParameter::MergeFrom(pFVar2,pFVar3);
    }
    if ((uVar1 & 2) != 0) {
      pFVar2 = mutable_bias_filler(this);
      pFVar3 = bias_filler(local_88);
      FillerParameter::MergeFrom(pFVar2,pFVar3);
    }
    if ((uVar1 & 4) != 0) {
      this->num_output_ = local_88->num_output_;
    }
    if ((uVar1 & 8) != 0) {
      this->pad_h_ = local_88->pad_h_;
    }
    if ((uVar1 & 0x10) != 0) {
      this->pad_w_ = local_88->pad_w_;
    }
    if ((uVar1 & 0x20) != 0) {
      this->kernel_h_ = local_88->kernel_h_;
    }
    if ((uVar1 & 0x40) != 0) {
      this->kernel_w_ = local_88->kernel_w_;
    }
    if ((uVar1 & 0x80) != 0) {
      this->stride_h_ = local_88->stride_h_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0x3f00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      this->stride_w_ = local_88->stride_w_;
    }
    if ((uVar1 & 0x200) != 0) {
      this->engine_ = local_88->engine_;
    }
    if ((uVar1 & 0x400) != 0) {
      this->force_nd_im2col_ = (bool)(local_88->force_nd_im2col_ & 1);
    }
    if ((uVar1 & 0x800) != 0) {
      this->axis_ = local_88->axis_;
    }
    if ((uVar1 & 0x1000) != 0) {
      this->bias_term_ = (bool)(local_88->bias_term_ & 1);
    }
    if ((uVar1 & 0x2000) != 0) {
      this->group_ = local_88->group_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void ConvolutionParameter::MergeFrom(const ConvolutionParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.ConvolutionParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  pad_.MergeFrom(from.pad_);
  kernel_size_.MergeFrom(from.kernel_size_);
  stride_.MergeFrom(from.stride_);
  dilation_.MergeFrom(from.dilation_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      mutable_weight_filler()->::caffe::FillerParameter::MergeFrom(from.weight_filler());
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_bias_filler()->::caffe::FillerParameter::MergeFrom(from.bias_filler());
    }
    if (cached_has_bits & 0x00000004u) {
      num_output_ = from.num_output_;
    }
    if (cached_has_bits & 0x00000008u) {
      pad_h_ = from.pad_h_;
    }
    if (cached_has_bits & 0x00000010u) {
      pad_w_ = from.pad_w_;
    }
    if (cached_has_bits & 0x00000020u) {
      kernel_h_ = from.kernel_h_;
    }
    if (cached_has_bits & 0x00000040u) {
      kernel_w_ = from.kernel_w_;
    }
    if (cached_has_bits & 0x00000080u) {
      stride_h_ = from.stride_h_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 16128u) {
    if (cached_has_bits & 0x00000100u) {
      stride_w_ = from.stride_w_;
    }
    if (cached_has_bits & 0x00000200u) {
      engine_ = from.engine_;
    }
    if (cached_has_bits & 0x00000400u) {
      force_nd_im2col_ = from.force_nd_im2col_;
    }
    if (cached_has_bits & 0x00000800u) {
      axis_ = from.axis_;
    }
    if (cached_has_bits & 0x00001000u) {
      bias_term_ = from.bias_term_;
    }
    if (cached_has_bits & 0x00002000u) {
      group_ = from.group_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}